

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  __pid_t _Var1;
  int iVar2;
  int *piVar3;
  long in_FS_OFFSET;
  int status_value;
  int local_124;
  allocator<char> local_11d;
  int local_11c;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  if ((this->super_DeathTestImpl).spawned_ == true) {
    DeathTestImpl::ReadAndInterpretStatusByte(&this->super_DeathTestImpl);
    do {
      _Var1 = waitpid(*(__pid_t *)&(this->super_DeathTestImpl).field_0x2c,&local_11c,0);
      if (_Var1 != -1) goto LAB_00155195;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    this = (ForkingDeathTest *)&local_f8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this,"CHECK failed: File ",&local_11d);
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_b8,&local_d8,", line ");
    local_124 = 0x407;
    StreamableToString<int>(&local_118,&local_124);
    std::operator+(&local_98,&local_b8,&local_118);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"waitpid(child_pid_, &status_value, 0)");
    std::operator+(&local_38,&local_58," != -1");
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_0015525b;
    DeathTestAbort(&local_38);
LAB_00155195:
    *(int *)((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this)->
                    field_2 + 0xc) = local_11c;
    iVar2 = local_11c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
LAB_0015525b:
  __stack_chk_fail();
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned())
    return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}